

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

void nop_random_cb(uv_random_t *req,int status,void *buf,size_t len)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  long lVar3;
  undefined1 auStack_8c8 [152];
  undefined1 auStack_830 [2056];
  
  if (status == -0x7d) {
    if (req + 1 != (uv_random_t *)buf) goto LAB_001760c7;
    if (len == 1) {
      done_cb_called = done_cb_called + 1;
      return;
    }
  }
  else {
    nop_random_cb_cold_1();
LAB_001760c7:
    nop_random_cb_cold_2();
  }
  nop_random_cb_cold_3();
  uVar2 = uv_default_loop();
  saturate_threadpool();
  lVar3 = 0;
  do {
    iVar1 = uv_queue_work(uVar2,auStack_830 + lVar3,work2_cb,done2_cb);
    if (iVar1 != 0) {
      run_test_threadpool_cancel_work_cold_1();
      goto LAB_001761e3;
    }
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x800);
  iVar1 = uv_timer_init(uVar2,auStack_8c8);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_8c8,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_001761e8;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001761ed;
    if (timer_cb_called != 1) goto LAB_001761f2;
    if (done2_cb_called == 0x10) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001761fc;
    }
  }
  else {
LAB_001761e3:
    run_test_threadpool_cancel_work_cold_2();
LAB_001761e8:
    run_test_threadpool_cancel_work_cold_3();
LAB_001761ed:
    run_test_threadpool_cancel_work_cold_4();
LAB_001761f2:
    run_test_threadpool_cancel_work_cold_5();
  }
  run_test_threadpool_cancel_work_cold_6();
LAB_001761fc:
  run_test_threadpool_cancel_work_cold_7();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,0x75,"0 && \"work2_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void nop_random_cb(uv_random_t* req, int status, void* buf, size_t len) {
  struct random_info* ri;

  ri = container_of(req, struct random_info, random_req);

  ASSERT(status == UV_ECANCELED);
  ASSERT(buf == (void*) ri->buf);
  ASSERT(len == sizeof(ri->buf));

  done_cb_called++;
}